

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O2

uchar * rans_uncompress_O1(uchar *in,uint in_size,uint *out_size)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  uint32_t start;
  uint uVar10;
  ulong uVar11;
  RansDecSymbol *pRVar12;
  uint *puVar13;
  byte *pbVar14;
  ulong uVar15;
  uint __c;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  RansDecSymbol syms [256] [256];
  ari_decoder D [256];
  uint uStack_c08c8;
  uint uStack_c08c4;
  uint uStack_c08c0;
  uint auStack_c08bc [4];
  uint uStack_c08ac;
  byte *pbStack_c08a8;
  RansDecSymbol *pRStack_c08a0;
  byte *pbStack_c0898;
  ulong uStack_c0890;
  uint uStack_c0884;
  uint *puStack_c0880;
  uint *puStack_c0878;
  size_t sStack_c0870;
  long lStack_c0868;
  long lStack_c0860;
  long lStack_c0858;
  ulong uStack_c0850;
  ulong uStack_c0848;
  ulong uStack_c0840;
  RansDecSymbol aRStack_c0838 [65536];
  uint uStack_80838;
  uint32_t auStack_80834 [511];
  long alStack_80038 [65537];
  
  memset(&uStack_80838,0,0x80800);
  if ((*in == '\x01') && (*(int *)(in + 1) == in_size - 9)) {
    uStack_c08ac = *(uint *)(in + 5);
    sStack_c0870 = (size_t)(int)uStack_c08ac;
    pbStack_c0898 = (byte *)malloc(sStack_c0870);
    uVar9 = 0;
    if (pbStack_c0898 != (byte *)0x0) {
      uVar17 = (uint)in[9];
      puVar13 = (uint *)(in + 10);
      puStack_c0878 = out_size;
      do {
        __c = (uint)(byte)*puVar13;
        puVar13 = (uint *)((long)puVar13 + 1);
        pbStack_c08a8 = (byte *)CONCAT44(pbStack_c08a8._4_4_,uVar17);
        lVar6 = (long)(int)uVar17;
        uVar17 = 0;
        pRStack_c08a0 = aRStack_c0838 + lVar6 * 0x100;
        start = 0;
        uStack_c0890 = uVar9;
        do {
          bVar1 = (byte)*puVar13;
          uVar10 = (uint)bVar1;
          lVar7 = (long)(int)__c;
          if ((char)bVar1 < '\0') {
            (&uStack_80838)[lVar6 * 0x202 + lVar7 * 2] = bVar1 & 0x7f;
            pbVar14 = (byte *)((long)puVar13 + 1);
            puVar13 = (uint *)((long)puVar13 + 2);
            uVar10 = (bVar1 & 0x7f) << 8 | (uint)*pbVar14;
          }
          else {
            puVar13 = (uint *)((long)puVar13 + 1);
          }
          auStack_80834[lVar6 * 0x202 + lVar7 * 2] = start;
          if (uVar10 == 0) {
            uVar10 = 0x1000;
          }
          (&uStack_80838)[lVar6 * 0x202 + lVar7 * 2] = uVar10;
          RansDecSymbolInit(pRStack_c08a0 + lVar7,start,uVar10);
          pvVar8 = (void *)alStack_80038[lVar6 * 0x101];
          if (pvVar8 == (void *)0x0) {
            pvVar8 = malloc(0x1000);
            alStack_80038[lVar6 * 0x101] = (long)pvVar8;
          }
          memset((void *)((long)(int)start + (long)pvVar8),__c,(ulong)uVar10);
          start = uVar10 + start;
          if (0x1000 < (int)start) {
            __assert_fail("x <= TOTFREQ",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                          ,0x25c,
                          "unsigned char *rans_uncompress_O1(unsigned char *, unsigned int, unsigned int *)"
                         );
          }
          if (uVar17 == 0) {
            uVar10 = *puVar13;
            if (__c + 1 == (uint)(byte)uVar10) {
              uVar17 = (uint)*(byte *)((long)puVar13 + 1);
              puVar13 = (uint *)((long)puVar13 + 2);
              goto LAB_00124dcb;
            }
            puVar13 = (uint *)((long)puVar13 + 1);
            uVar17 = 0;
            __c = (uint)(byte)uVar10;
          }
          else {
            uVar17 = uVar17 - 1;
LAB_00124dcb:
            __c = __c + 1;
          }
        } while (__c != 0);
        if ((int)uStack_c0890 == 0) {
          uVar17 = (uint)(byte)*puVar13;
          if ((int)pbStack_c08a8 + 1U == uVar17) {
            uVar9 = (ulong)*(byte *)((long)puVar13 + 1);
            puVar13 = (uint *)((long)puVar13 + 2);
            uVar17 = (int)pbStack_c08a8 + 1U;
          }
          else {
            puVar13 = (uint *)((long)puVar13 + 1);
            uVar9 = 0;
          }
        }
        else {
          uVar9 = (ulong)((int)uStack_c0890 - 1);
          uVar17 = (int)pbStack_c08a8 + 1;
        }
        if (uVar17 == 0) {
          puStack_c0880 = puVar13 + 4;
          uVar17 = (int)uStack_c08ac >> 2;
          uStack_c08c8 = *puVar13;
          uStack_c08c4 = puVar13[1];
          uStack_c08c0 = (uint)*(undefined8 *)(puVar13 + 2);
          auStack_c08bc[0] = (uint)((ulong)*(undefined8 *)(puVar13 + 2) >> 0x20);
          lStack_c0858 = (long)(int)(uVar17 * 3);
          lStack_c0860 = (long)(int)(uVar17 * 2);
          lStack_c0868 = (long)(int)uVar17;
          uVar9 = 0;
          uStack_c0850 = 0;
          if (0 < (int)uVar17) {
            uStack_c0850 = (ulong)uVar17;
          }
          uStack_c0850 = -uStack_c0850;
          lVar6 = lStack_c0858;
          uVar11 = 0;
          pRVar12 = (RansDecSymbol *)0x0;
          pbVar14 = pbStack_c0898;
          uVar15 = 0;
          uVar20 = 0;
          while (lVar7 = lStack_c0858, sVar5 = sStack_c0870, uStack_c0850 != uVar9) {
            uStack_c0840 = (ulong)uStack_c08c4 & 0xfff;
            bVar1 = *(byte *)(alStack_80038[uVar15 * 0x101] + ((ulong)uStack_c08c8 & 0xfff));
            uVar16 = (ulong)bVar1;
            bVar2 = *(byte *)(alStack_80038[(long)pRVar12 * 0x101] + uStack_c0840);
            pRStack_c08a0 = (RansDecSymbol *)(ulong)bVar2;
            bVar3 = *(byte *)(alStack_80038[uVar11 * 0x101] + ((ulong)uStack_c08c0 & 0xfff));
            uVar18 = (ulong)bVar3;
            bVar4 = *(byte *)(alStack_80038[uVar20 * 0x101] + ((ulong)auStack_c08bc[0] & 0xfff));
            uVar19 = (ulong)bVar4;
            uStack_c08c8 = ((uStack_c08c8 >> 0xc) *
                            (uint)aRStack_c0838[uVar15 * 0x100 + uVar16].freq +
                           (int)((ulong)uStack_c08c8 & 0xfff)) -
                           (uint)aRStack_c0838[uVar15 * 0x100 + uVar16].start;
            uStack_c08c4 = ((uStack_c08c4 >> 0xc) *
                            (uint)aRStack_c0838[(long)(pRStack_c08a0 + (long)pRVar12 * 0x40)].freq +
                           (int)uStack_c0840) -
                           (uint)aRStack_c0838[(long)(pRStack_c08a0 + (long)pRVar12 * 0x40)].start;
            uStack_c08c0 = ((uStack_c08c0 >> 0xc) *
                            (uint)aRStack_c0838[uVar11 * 0x100 + uVar18].freq +
                           (int)((ulong)uStack_c08c0 & 0xfff)) -
                           (uint)aRStack_c0838[uVar11 * 0x100 + uVar18].start;
            auStack_c08bc[0] =
                 ((auStack_c08bc[0] >> 0xc) * (uint)aRStack_c0838[uVar20 * 0x100 + uVar19].freq +
                 (int)((ulong)auStack_c08bc[0] & 0xfff)) -
                 (uint)aRStack_c0838[uVar20 * 0x100 + uVar19].start;
            *pbVar14 = bVar1;
            pbVar14[lStack_c0868] = bVar2;
            pbVar14[lStack_c0860] = bVar3;
            pbVar14[lStack_c0858] = bVar4;
            pbStack_c08a8 = pbVar14;
            uStack_c0890 = uVar9;
            uStack_c0848 = uVar18;
            RansDecRenorm(&uStack_c08c8,(uint8_t **)&puStack_c0880);
            RansDecRenorm(&uStack_c08c4,(uint8_t **)&puStack_c0880);
            RansDecRenorm(&uStack_c08c0,(uint8_t **)&puStack_c0880);
            RansDecRenorm(auStack_c08bc,(uint8_t **)&puStack_c0880);
            pbVar14 = pbVar14 + 1;
            lVar6 = lVar7;
            uVar11 = uVar18;
            pRVar12 = pRStack_c08a0;
            uVar15 = uVar16;
            uVar20 = uVar19;
            uVar9 = uStack_c0890 - 1;
          }
          uStack_c0884 = auStack_c08bc[0];
          for (lVar6 = lVar6 - uVar9; lVar6 < (long)sVar5; lVar6 = lVar6 + 1) {
            bVar1 = *(byte *)(alStack_80038[uVar20 * 0x101] + (ulong)(uStack_c0884 & 0xfff));
            pbStack_c0898[lVar6] = bVar1;
            RansDecAdvanceSymbol
                      (&uStack_c0884,(uint8_t **)&puStack_c0880,
                       aRStack_c0838 + uVar20 * 0x100 + (ulong)bVar1,(uint32_t)pbStack_c0898);
            uVar20 = (ulong)bVar1;
          }
          *puStack_c0878 = uStack_c08ac;
          for (lVar6 = 0x800; lVar6 != 0x81000; lVar6 = lVar6 + 0x808) {
            free(*(void **)((long)&uStack_80838 + lVar6));
          }
          return pbStack_c0898;
        }
      } while( true );
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *rans_uncompress_O1(unsigned char *in, unsigned int in_size,
				  unsigned int *out_size) {
    /* Load in the static tables */
    unsigned char *cp = in + 9;
    int i, j = -999, x, out_sz, in_sz, rle_i, rle_j;
    char *out_buf;
    ari_decoder D[256];
    RansDecSymbol syms[256][256];

    memset(D, 0, 256*sizeof(*D));

    if (*in++ != 1) // Order-1 check
	return NULL;

    in_sz  = ((in[0])<<0) | ((in[1])<<8) | ((in[2])<<16) | ((in[3])<<24);
    out_sz = ((in[4])<<0) | ((in[5])<<8) | ((in[6])<<16) | ((in[7])<<24);
    if (in_sz != in_size-9)
	return NULL;

    out_buf = malloc(out_sz);
    if (!out_buf)
	return NULL;

    //fprintf(stderr, "out_sz=%d\n", out_sz);

    //i = *cp++;
    rle_i = 0;
    i = *cp++;
    do {
	rle_j = x = 0;
	j = *cp++;
	do {
	    if ((D[i].fc[j].F = *cp++) >= 128) {
		D[i].fc[j].F &= ~128;
		D[i].fc[j].F = ((D[i].fc[j].F & 127) << 8) | *cp++;
	    }
	    D[i].fc[j].C = x;

	    //fprintf(stderr, "i=%d j=%d F=%d C=%d\n", i, j, D[i].fc[j].F, D[i].fc[j].C);

	    if (!D[i].fc[j].F)
		D[i].fc[j].F = TOTFREQ;

	    RansDecSymbolInit(&syms[i][j], D[i].fc[j].C, D[i].fc[j].F);

	    /* Build reverse lookup table */
	    if (!D[i].R) D[i].R = (unsigned char *)malloc(TOTFREQ);
	    memset(&D[i].R[x], j, D[i].fc[j].F);

	    x += D[i].fc[j].F;
	    assert(x <= TOTFREQ);

	    if (!rle_j && j+1 == *cp) {
		j = *cp++;
		rle_j = *cp++;
	    } else if (rle_j) {
		rle_j--;
		j++;
	    } else {
		j = *cp++;
	    }
	} while(j);

	if (!rle_i && i+1 == *cp) {
	    i = *cp++;
	    rle_i = *cp++;
	} else if (rle_i) {
	    rle_i--;
	    i++;
	} else {
	    i = *cp++;
	}
    } while (i);

    // Precompute reverse lookup of frequency.

    RansState rans0, rans1, rans2, rans3;
    uint8_t *ptr = cp;
    RansDecInit(&rans0, &ptr);
    RansDecInit(&rans1, &ptr);
    RansDecInit(&rans2, &ptr);
    RansDecInit(&rans3, &ptr);

    int isz4 = out_sz>>2;
    int l0 = 0;
    int l1 = 0;
    int l2 = 0;
    int l3 = 0;
    int i4[] = {0*isz4, 1*isz4, 2*isz4, 3*isz4};

    RansState R[4];
    R[0] = rans0;
    R[1] = rans1;
    R[2] = rans2;
    R[3] = rans3;

    for (; i4[0] < isz4; i4[0]++, i4[1]++, i4[2]++, i4[3]++) {
	uint32_t m[4] = {R[0] & ((1u << TF_SHIFT)-1),
			 R[1] & ((1u << TF_SHIFT)-1),
			 R[2] & ((1u << TF_SHIFT)-1),
			 R[3] & ((1u << TF_SHIFT)-1)};

	uint8_t c[4] = {D[l0].R[m[0]],
			D[l1].R[m[1]],
			D[l2].R[m[2]],
			D[l3].R[m[3]]};

	out_buf[i4[0]] = c[0];
	out_buf[i4[1]] = c[1];
	out_buf[i4[2]] = c[2];
	out_buf[i4[3]] = c[3];

	//RansDecAdvanceSymbolStep(&R[0], &syms[l0][c[0]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[1], &syms[l1][c[1]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[2], &syms[l2][c[2]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[3], &syms[l3][c[3]], TF_SHIFT);

	R[0] = syms[l0][c[0]].freq * (R[0]>>TF_SHIFT);
	R[1] = syms[l1][c[1]].freq * (R[1]>>TF_SHIFT);
	R[2] = syms[l2][c[2]].freq * (R[2]>>TF_SHIFT);
	R[3] = syms[l3][c[3]].freq * (R[3]>>TF_SHIFT);

	R[0] += m[0] - syms[l0][c[0]].start;
	R[1] += m[1] - syms[l1][c[1]].start;
	R[2] += m[2] - syms[l2][c[2]].start;
	R[3] += m[3] - syms[l3][c[3]].start;

	RansDecRenorm(&R[0], &ptr);
	RansDecRenorm(&R[1], &ptr);
	RansDecRenorm(&R[2], &ptr);
	RansDecRenorm(&R[3], &ptr);

	l0 = c[0];
	l1 = c[1];
	l2 = c[2];
	l3 = c[3];
    }

    rans0 = R[0];
    rans1 = R[1];
    rans2 = R[2];
    rans3 = R[3];

    // Remainder
    for (; i4[3] < out_sz; i4[3]++) {
	unsigned char c3 = D[l3].R[RansDecGet(&rans3, TF_SHIFT)];
	out_buf[i4[3]] = c3;
	RansDecAdvanceSymbol(&rans3, &ptr, &syms[l3][c3], TF_SHIFT);
	l3 = c3;
    }

    *out_size = out_sz;

    for (i = 0; i < 256; i++)
	if (D[i].R) free(D[i].R);

    return (unsigned char *)out_buf;
}